

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O3

BigNumber *
partial_multiplication(BigNumber *__return_storage_ptr__,BigNumber *nb1,BigNumber *nb2,uint r)

{
  unsigned_long uVar1;
  const_iterator __position;
  void *pvVar2;
  uint uVar3;
  pointer puVar4;
  pointer puVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  pointer puVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> resultat_intermedaire;
  BigNumber tmp;
  uint local_124;
  BigNumber *local_120;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_118;
  BigNumber *local_f8;
  uint local_ec;
  uint local_e8;
  value_type local_e4;
  BigNumber *local_e0;
  BigNumber local_d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  ulong local_a0;
  pointer local_98;
  BigNumber local_90;
  BigNumber local_70;
  BigNumber local_50;
  
  uVar1 = nb1->m_base;
  local_e0 = nb2;
  Polynome::Polynome(&__return_storage_ptr__->super_Polynome);
  __return_storage_ptr__->m_base = uVar1;
  puVar4 = (nb1->super_Polynome).m_coef.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(nb1->super_Polynome).m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar4) >> 2) != 0) {
    uVar20 = 0;
    local_120 = __return_storage_ptr__;
    local_f8 = nb1;
    do {
      local_124 = 0;
      local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      puVar5 = (local_e0->super_Polynome).m_coef.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar10 = (local_e0->super_Polynome).m_coef.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (puVar10 != puVar5) {
        local_e8 = puVar4[uVar20] & 0xffff;
        local_ec = puVar4[uVar20] >> 0x10;
        uVar18 = 0;
        local_a0 = uVar20;
        do {
          if (uVar20 + uVar18 < (ulong)r) {
            uVar6 = puVar5[uVar18] >> 0x10;
            uVar9 = puVar5[uVar18] & 0xffff;
            uVar12 = uVar9 * local_e8;
            uVar11 = uVar6 * local_e8;
            uVar9 = uVar9 * local_ec;
            uVar6 = uVar6 * local_ec;
            uVar13 = local_124 & 0xffff;
            uVar7 = 0x10000 - uVar13;
            uVar3 = uVar12 & 0xffff;
            iVar17 = (uint)(uVar7 <= uVar3) + (local_124 >> 0x10);
            uVar12 = uVar12 >> 0x10;
            iVar15 = iVar17 + -0x10000;
            if (uVar12 < 0x10000U - iVar17) {
              iVar15 = iVar17;
            }
            uVar16 = (uint)(0x10000U - iVar17 <= uVar12);
            iVar15 = iVar15 + uVar12;
            uVar14 = uVar11 & 0xffff;
            uVar12 = uVar16 + 1;
            if (uVar14 < 0x10000U - iVar15) {
              uVar12 = uVar16;
            }
            iVar17 = iVar15 + -0x10000;
            if (uVar14 < 0x10000U - iVar15) {
              iVar17 = iVar15;
            }
            uVar19 = (uVar12 + 1) - (uint)((uVar9 & 0xffff) < 0x10000 - (iVar17 + uVar14));
            uVar16 = uVar6 & 0xffff;
            uVar12 = uVar19 | 0xffff0000;
            if (uVar16 < 0x10000 - uVar19) {
              uVar12 = uVar19;
            }
            uVar19 = (uint)(0x10000 - uVar19 <= uVar16);
            iVar8 = uVar12 + uVar16;
            uVar11 = uVar11 >> 0x10;
            iVar15 = iVar8 + -0x10000;
            if (uVar11 < 0x10000U - iVar8) {
              iVar15 = iVar8;
            }
            uVar12 = uVar19 + 1;
            if (uVar11 < 0x10000U - iVar8) {
              uVar12 = uVar19;
            }
            iVar15 = iVar15 + uVar11;
            uVar11 = uVar9 >> 0x10;
            iVar8 = iVar15 + -0x10000;
            if (uVar11 < 0x10000U - iVar15) {
              iVar8 = iVar15;
            }
            iVar15 = (0x10000U - iVar15 <= uVar11) + uVar12;
            uVar6 = uVar6 >> 0x10;
            local_124 = ((iVar8 + uVar11 + 1) - (uint)(uVar6 < 0x10000U - iVar15)) +
                        (iVar15 + uVar6) * 0x10000;
            local_d8.super_Polynome.m_coef.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ =
                 uVar3 + uVar13 + (uint)(uVar3 < uVar7) * 0x10000 + -0x10000 +
                 (iVar17 + uVar14 + uVar9) * 0x10000;
            if (local_f8->m_base >> 0x20 == 0) {
              local_d8.super_Polynome.m_coef.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ =
                   (uint)((ulong)(uint)local_d8.super_Polynome.m_coef.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start %
                         (local_f8->m_base & 0xffffffff));
              local_124 = 0;
            }
            uVar20 = local_a0;
            local_98 = puVar10;
            if (local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_118,
                         (iterator)
                         local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d8);
              puVar5 = (local_e0->super_Polynome).m_coef.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar10 = (local_e0->super_Polynome).m_coef.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            else {
              *local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish =
                   (uint)local_d8.super_Polynome.m_coef.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
          }
          __return_storage_ptr__ = local_120;
          uVar18 = uVar18 + 1;
        } while (uVar18 < (ulong)((long)puVar10 - (long)puVar5 >> 2));
        if (local_124 != 0) {
          if (local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_118,
                       (iterator)
                       local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_124);
          }
          else {
            *local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_124;
            local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_b8,&local_118);
      BigNumber::BigNumber(&local_d8,&local_b8,local_f8->m_base);
      if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (0 < (int)uVar20) {
        uVar18 = uVar20 & 0xffffffff;
        do {
          __position._M_current._4_4_ =
               local_d8.super_Polynome.m_coef.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_;
          __position._M_current._0_4_ =
               (uint)local_d8.super_Polynome.m_coef.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          local_e4 = 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_insert_rval
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d8,__position,
                     &local_e4);
          uVar3 = (int)uVar18 - 1;
          uVar18 = (ulong)uVar3;
        } while (uVar3 != 0);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__);
      local_90.m_base = __return_storage_ptr__->m_base;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d8);
      local_50.m_base = local_d8.m_base;
      operator+(&local_70,&local_90,&local_50);
      __return_storage_ptr__->m_base = local_70.m_base;
      puVar4 = (__return_storage_ptr__->super_Polynome).m_coef.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((__return_storage_ptr__->super_Polynome).m_coef.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar4) {
        (__return_storage_ptr__->super_Polynome).m_coef.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar4;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70);
      if (local_70.super_Polynome.m_coef.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.super_Polynome.m_coef.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_70.super_Polynome.m_coef.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.super_Polynome.m_coef.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_50.super_Polynome.m_coef.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.super_Polynome.m_coef.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_50.super_Polynome.m_coef.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.super_Polynome.m_coef.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_90.super_Polynome.m_coef.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.super_Polynome.m_coef.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_90.super_Polynome.m_coef.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.super_Polynome.m_coef.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pvVar2 = (void *)CONCAT44(local_d8.super_Polynome.m_coef.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (uint)local_d8.super_Polynome.m_coef.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)local_d8.super_Polynome.m_coef.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar2);
      }
      if (local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_118.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      uVar20 = uVar20 + 1;
      puVar4 = (local_f8->super_Polynome).m_coef.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar20 < ((ulong)((long)(local_f8->super_Polynome).m_coef.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4) >> 2
                      & 0xffffffff));
  }
  return __return_storage_ptr__;
}

Assistant:

BigNumber partial_multiplication(BigNumber& nb1, BigNumber& nb2, const unsigned int r){
//    clock_t t1, t2;
//    static clock_t t_tmp;
//    static unsigned int cmp = 0;
//    t1 = clock();
    const unsigned int SIZE_INT16 = 65536;
    BigNumber resultat(nb1.m_base);
    for(unsigned long i = 0; i < nb1.m_degre() ; i++) {
        unsigned int retenue = 0;
        vector<unsigned int> resultat_intermedaire;

        /*
         * On split la valeur du m_coef de 32 bits en deux valeurs de 16 bits
         * On a m_coef = [high1 low1]
         */
        const unsigned int high1 = (nb1.m_coef[i] >> 16);
        const unsigned int low1 = (nb1.m_coef[i] & 0x0000FFFF);

        for (unsigned long j = 0; j < nb2.m_coef.size(); j++) {
            /*
             * Calcul des résultats intermédiaires des sous-blocks de 16bits des opérandes
             */
            if(i + j < r) {

                const unsigned int high2 = (nb2.m_coef[j] >> 16);
                const unsigned int low2 = (nb2.m_coef[j] & 0x0000FFFF);

                /*
                 * On multiplie de nombre de 16 bits; le résultat sera inferieur a 32bits donc pas d'overflow
                 */
                const unsigned int res1 = low1 * low2;
                const unsigned int res2 = high2 * low1;
                const unsigned int res3 = low2 * high1;
                const unsigned int res4 = high1 * high2;


                /*
                 * Calcul du résultat de la multiplication sur 32 bits
                 */


                unsigned int resultat32b = 0;

                /*
                 * Le resultat de la multiplication est donné par [left1, right1]
                 * La retenue est donné par [left2, right2]
                 */
                unsigned int right2 = 0;
                unsigned int left2 = 0;
                unsigned int left1 = 0;
                /*
                 * On initialise a la valeur de la retenue précédente
                 */
                unsigned int right1 = retenue;
                retenue = 0;

                /*
                 * Valeurs sur 16bits ! Si ca dépasse on fait passer l'exédent sur les 16bits suivants
                 * right1 -> left1
                 * left1 -> right2
                 * right2 -> left2
                 * left2 -> retenue
                 */
                left1 = right1 / SIZE_INT16;
                right1 = right1 % SIZE_INT16;

                /*
                 * On additionne avec prudence en vérifiant les overflows possible
                 * pour former le résultat et la retenue sur 32 bits
                 */
                if (SIZE_INT16 - right1 > (res1 & 0x0000FFFF)) {
                    right1 += (res1 & 0x0000FFFF);
                } else {
                    right1 -= SIZE_INT16;
                    right1 += (res1 & 0x0000FFFF);
                    left1 += 1;
                }

                if (SIZE_INT16 - left1 > (res1 >> 16)) {
                    left1 += (res1 >> 16);
                } else {
                    left1 -= SIZE_INT16;
                    left1 += (res1 >> 16);
                    right2 += 1;
                }

                if (SIZE_INT16 - left1 > (res2 & 0x0000FFFF)) {
                    left1 += (res2 & 0x0000FFFF);
                } else {
                    left1 -= SIZE_INT16;
                    left1 += (res2 & 0x0000FFFF);
                    right2 += 1;
                }

                if (SIZE_INT16 - left1 > (res3 & 0x0000FFFF)) {
                    left1 += (res3 & 0x0000FFFF);
                } else {
                    left1 -= SIZE_INT16;
                    left1 += (res3 & 0x0000FFFF);
                    right2 += 1;
                }

                /*
                 * Calcul de la retenue
                 */

                if (SIZE_INT16 - right2 > (res4 & 0x0000FFFF)) {
                    right2 += (res4 & 0x0000FFFF);
                } else {
                    right2 -= SIZE_INT16;
                    right2 += (res4 & 0x0000FFFF);
                    left2 += 1;
                }

                if (SIZE_INT16 - right2 > (res2 >> 16)) {
                    right2 += (res2 >> 16);
                } else {
                    right2 -= SIZE_INT16;
                    right2 += (res2 >> 16);
                    left2 += 1;
                }

                if (SIZE_INT16 - right2 > (res3 >> 16)) {
                    right2 += (res3 >> 16);
                } else {
                    right2 -= SIZE_INT16;
                    right2 += (res3 >> 16);
                    left2 += 1;
                }

                if (SIZE_INT16 - left2 > (res4 >> 16)) {
                    left2 += (res4 >> 16);
                } else {
                    left2 -= SIZE_INT16;
                    left2 += (res4 >> 16);
                    retenue += 1;
                }

                retenue += (left2 << 16) + right2;
                resultat32b += (left1 << 16) + right1;
                if (nb1.m_base < 4294967296) {
                    resultat32b = resultat32b % (unsigned int) nb1.m_base;
                    retenue = resultat32b / (unsigned int) nb1.m_base;
                }
                resultat_intermedaire.emplace_back(resultat32b);
            }
        }

        if(retenue != 0){
            resultat_intermedaire.emplace_back(retenue);
        }
        BigNumber tmp(resultat_intermedaire, nb1.m_base);
        tmp >> i;
        resultat = resultat + tmp;
    }
//    t2 = clock();
//    t_tmp += (t2 - t1);
//    cmp += 1;
//    cout << "Multiplication : " << t_tmp / (float)cmp << endl;

    return resultat;
}